

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

SynchEvent * absl::EnsureSynchEvent(atomic<long> *addr,char *name,intptr_t bits,intptr_t lockbit)

{
  uintptr_t uVar1;
  size_t sVar2;
  uintptr_t uVar3;
  ulong uVar4;
  bool bVar5;
  size_t l;
  SynchEvent *e;
  uint32_t h;
  intptr_t lockbit_local;
  intptr_t bits_local;
  char *name_local;
  atomic<long> *addr_local;
  
  uVar4 = (long)addr % 0x407;
  base_internal::SpinLock::Lock((SpinLock *)&synch_event_mu);
  l = *(size_t *)(synch_event + (uVar4 & 0xffffffff) * 8);
  while( true ) {
    bVar5 = false;
    if (l != 0) {
      uVar3 = *(uintptr_t *)(l + 0x10);
      uVar1 = base_internal::HidePtr<std::atomic<long>>(addr);
      bVar5 = uVar3 != uVar1;
    }
    if (!bVar5) break;
    l = *(size_t *)(l + 8);
  }
  if (l == 0) {
    bits_local = (intptr_t)name;
    if (name == (char *)0x0) {
      bits_local = (long)"\x05\x05\x04" + 3;
    }
    sVar2 = strlen((char *)bits_local);
    l = (size_t)base_internal::LowLevelAlloc::Alloc(sVar2 + 0x30);
    *(undefined4 *)l = 2;
    uVar3 = base_internal::HidePtr<std::atomic<long>>(addr);
    *(uintptr_t *)(l + 0x10) = uVar3;
    *(undefined8 *)(l + 0x18) = 0;
    *(undefined8 *)(l + 0x20) = 0;
    *(undefined1 *)(l + 0x28) = 0;
    strcpy((char *)(l + 0x29),(char *)bits_local);
    *(undefined8 *)(l + 8) = *(undefined8 *)(synch_event + (uVar4 & 0xffffffff) * 8);
    AtomicSetBits(addr,bits,lockbit);
    *(size_t *)(synch_event + (uVar4 & 0xffffffff) * 8) = l;
  }
  else {
    *(int *)l = *(int *)l + 1;
  }
  base_internal::SpinLock::Unlock((SpinLock *)&synch_event_mu);
  return (SynchEvent *)l;
}

Assistant:

static SynchEvent *EnsureSynchEvent(std::atomic<intptr_t> *addr,
                                    const char *name, intptr_t bits,
                                    intptr_t lockbit) {
  uint32_t h = reinterpret_cast<intptr_t>(addr) % kNSynchEvent;
  SynchEvent *e;
  // first look for existing SynchEvent struct..
  synch_event_mu.Lock();
  for (e = synch_event[h];
       e != nullptr && e->masked_addr != base_internal::HidePtr(addr);
       e = e->next) {
  }
  if (e == nullptr) {  // no SynchEvent struct found; make one.
    if (name == nullptr) {
      name = "";
    }
    size_t l = strlen(name);
    e = reinterpret_cast<SynchEvent *>(
        base_internal::LowLevelAlloc::Alloc(sizeof(*e) + l));
    e->refcount = 2;    // one for return value, one for linked list
    e->masked_addr = base_internal::HidePtr(addr);
    e->invariant = nullptr;
    e->arg = nullptr;
    e->log = false;
    strcpy(e->name, name);  // NOLINT(runtime/printf)
    e->next = synch_event[h];
    AtomicSetBits(addr, bits, lockbit);
    synch_event[h] = e;
  } else {
    e->refcount++;      // for return value
  }
  synch_event_mu.Unlock();
  return e;
}